

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeMoveWindows(ImGuiDockNode *dst_node,ImGuiDockNode *src_node)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiTabBar *this_00;
  ImGuiWindow *window;
  byte bVar1;
  ImGuiTabItem *pIVar2;
  ImGuiWindow **ppIVar3;
  int n;
  int i;
  
  if (((dst_node == src_node) || (dst_node == (ImGuiDockNode *)0x0)) ||
     (src_node == (ImGuiDockNode *)0x0)) {
    __assert_fail("src_node && dst_node && dst_node != src_node",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3555,"void ImGui::DockNodeMoveWindows(ImGuiDockNode *, ImGuiDockNode *)");
  }
  this_00 = src_node->TabBar;
  i = 0;
  if (this_00 != (ImGuiTabBar *)0x0) {
    if ((this_00->Tabs).Size < (src_node->Windows).Size) {
      __assert_fail("src_node->Windows.Size <= src_node->TabBar->Tabs.Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3558,"void ImGui::DockNodeMoveWindows(ImGuiDockNode *, ImGuiDockNode *)");
    }
    if (dst_node->TabBar == (ImGuiTabBar *)0x0) {
      dst_node->TabBar = this_00;
      src_node->TabBar = (ImGuiTabBar *)0x0;
      bVar1 = 1;
      goto LAB_00140a2e;
    }
  }
  bVar1 = 0;
LAB_00140a2e:
  this = &src_node->Windows;
  for (; i < this->Size; i = i + 1) {
    if (this_00 == (ImGuiTabBar *)0x0) {
      ppIVar3 = ImVector<ImGuiWindow_*>::operator[](this,i);
    }
    else {
      pIVar2 = ImVector<ImGuiTabItem>::operator[](&this_00->Tabs,i);
      ppIVar3 = &pIVar2->Window;
    }
    window = *ppIVar3;
    if (window != (ImGuiWindow *)0x0) {
      window->DockNode = (ImGuiDockNode *)0x0;
      window->field_0x3e1 = window->field_0x3e1 & 0xfe;
      DockNodeAddWindow(dst_node,window,(bool)(bVar1 ^ 1));
    }
  }
  ImVector<ImGuiWindow_*>::clear(this);
  if ((bVar1 == 0) && (src_node->TabBar != (ImGuiTabBar *)0x0)) {
    if (dst_node->TabBar != (ImGuiTabBar *)0x0) {
      dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
    }
    DockNodeRemoveTabBar(src_node);
    return;
  }
  return;
}

Assistant:

static void ImGui::DockNodeMoveWindows(ImGuiDockNode* dst_node, ImGuiDockNode* src_node)
{
    // Insert tabs in the same orders as currently ordered (node->Windows isn't ordered)
    IM_ASSERT(src_node && dst_node && dst_node != src_node);
    ImGuiTabBar* src_tab_bar = src_node->TabBar;
    if (src_tab_bar != NULL)
        IM_ASSERT(src_node->Windows.Size <= src_node->TabBar->Tabs.Size);

    // If the dst_node is empty we can just move the entire tab bar (to preserve selection, scrolling, etc.)
    bool move_tab_bar = (src_tab_bar != NULL) && (dst_node->TabBar == NULL);
    if (move_tab_bar)
    {
        dst_node->TabBar = src_node->TabBar;
        src_node->TabBar = NULL;
    }

    for (int n = 0; n < src_node->Windows.Size; n++)
    {
        // DockNode's TabBar may have non-window Tabs manually appended by user
        if (ImGuiWindow* window = src_tab_bar ? src_tab_bar->Tabs[n].Window : src_node->Windows[n])
        {
            window->DockNode = NULL;
            window->DockIsActive = false;
            DockNodeAddWindow(dst_node, window, move_tab_bar ? false : true);
        }
    }
    src_node->Windows.clear();

    if (!move_tab_bar && src_node->TabBar)
    {
        if (dst_node->TabBar)
            dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
        DockNodeRemoveTabBar(src_node);
    }
}